

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int NGA_Create_ghosts_irreg64
              (int type,int ndim,int64_t *dims,int64_t *width,char *name,int64_t *block,int64_t *map
              )

{
  Integer *array_name;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_R9;
  int i_2;
  int i_1;
  int i;
  Integer *_ga_map_capi;
  Integer _ga_width [7];
  Integer _ga_work [7];
  Integer _ga_dims [7];
  logical st;
  Integer g_a;
  int local_10c;
  int iVar1;
  int iVar2;
  int64_t *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int64_t *in_stack_ffffffffffffff10;
  Integer in_stack_ffffffffffffff18;
  Integer in_stack_ffffffffffffff20;
  Integer *in_stack_ffffffffffffff30;
  Integer *in_stack_ffffffffffffff38;
  undefined8 local_b8 [8];
  undefined8 local_78 [7];
  long local_40;
  int local_38;
  long local_30;
  long local_20;
  long local_18;
  int local_c;
  int local_4;
  
  if (in_ESI < 8) {
    local_30 = in_R9;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_c = in_ESI;
    for (iVar2 = 0; iVar2 < local_c; iVar2 = iVar2 + 1) {
      local_78[(local_c - iVar2) + -1] = *(undefined8 *)(local_18 + (long)iVar2 * 8);
    }
    for (iVar1 = 0; iVar1 < local_c; iVar1 = iVar1 + 1) {
      local_b8[(local_c - iVar1) + -1] = *(undefined8 *)(local_30 + (long)iVar1 * 8);
    }
    for (local_10c = 0; local_10c < local_c; local_10c = local_10c + 1) {
      *(undefined8 *)(&stack0xffffffffffffff08 + (long)((local_c - local_10c) + -1) * 8) =
           *(undefined8 *)(local_20 + (long)local_10c * 8);
    }
    array_name = copy_map64(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                            in_stack_ffffffffffffff00);
    _ga_irreg_flag = 1;
    local_40 = pnga_create_ghosts_irreg
                         (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                          in_stack_ffffffffffffff10,
                          (Integer *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                          (char *)array_name,(Integer *)CONCAT44(iVar2,iVar1),
                          in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
    _ga_irreg_flag = 0;
    free(array_name);
    if (local_40 == 1) {
      local_4 = local_38;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int NGA_Create_ghosts_irreg64(int type,int ndim,int64_t dims[],int64_t width[],char *name, int64_t block[],int64_t map[])
{
    Integer g_a;
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    Integer _ga_width[MAXDIM];
    Integer *_ga_map_capi;
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    COPYC2F(block,_ga_work, ndim);
    COPYC2F(width,_ga_width, ndim);
    _ga_map_capi = copy_map64(block, ndim, map);

    _ga_irreg_flag = 1; /* set this flag=1, to indicate array is irregular */
    st = wnga_create_ghosts_irreg(type, (Integer)ndim, _ga_dims, _ga_width,
            name, _ga_map_capi, _ga_work, &g_a);
    _ga_irreg_flag = 0; /* unset it, after creating array */ 
     
    free(_ga_map_capi);
    if(st==TRUE) return (int) g_a;
    else return 0;
}